

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.cpp
# Opt level: O0

SRes crnlib::LzmaEnc_Encode
               (CLzmaEncHandle pp,ISeqOutStream *outStream,ISeqInStream *inStream,
               ICompressProgress *progress,ISzAlloc *alloc,ISzAlloc *allocBig)

{
  SRes SVar1;
  SRes local_4c;
  int __result__;
  SRes res;
  CLzmaEnc *p;
  ISzAlloc *allocBig_local;
  ISzAlloc *alloc_local;
  ICompressProgress *progress_local;
  ISeqInStream *inStream_local;
  ISeqOutStream *outStream_local;
  CLzmaEncHandle pp_local;
  
  pp_local._4_4_ = LzmaEnc_Prepare(pp,inStream,outStream,alloc,allocBig);
  if (pp_local._4_4_ == 0) {
    do {
      local_4c = LzmaEnc_CodeOneBlock((CLzmaEnc *)pp,0,0,0);
      if ((local_4c != 0) || (*(int *)((long)pp + 0x3d344) != 0)) goto LAB_0021cb8f;
    } while ((progress == (ICompressProgress *)0x0) ||
            (SVar1 = (*progress->Progress)
                               (progress,*(UInt64 *)((long)pp + 0x3d338),
                                *(long *)((long)pp + 0x3d320) +
                                (*(long *)((long)pp + 0x3d300) - *(long *)((long)pp + 0x3d310)) +
                                *(long *)((long)pp + 0x3d2f8)), SVar1 == 0));
    local_4c = 10;
LAB_0021cb8f:
    LzmaEnc_Finish(pp);
    pp_local._4_4_ = local_4c;
  }
  return pp_local._4_4_;
}

Assistant:

SRes LzmaEnc_Encode(CLzmaEncHandle pp, ISeqOutStream* outStream, ISeqInStream* inStream, ICompressProgress* progress,
                    ISzAlloc* alloc, ISzAlloc* allocBig) {
  CLzmaEnc* p = (CLzmaEnc*)pp;
  SRes res = SZ_OK;

#ifdef COMPRESS_MF_MT
  Byte allocaDummy[0x300];
  (void)allocaDummy;
  int i = 0;
  for (i = 0; i < 16; i++)
    allocaDummy[i] = (Byte)i;
#endif

  RINOK(LzmaEnc_Prepare(pp, inStream, outStream, alloc, allocBig));

  for (;;) {
    res = LzmaEnc_CodeOneBlock(p, False, 0, 0);
    if (res != SZ_OK || p->finished != 0)
      break;
    if (progress != 0) {
      res = progress->Progress(progress, p->nowPos64, RangeEnc_GetProcessed(&p->rc));
      if (res != SZ_OK) {
        res = SZ_ERROR_PROGRESS;
        break;
      }
    }
  }
  LzmaEnc_Finish(pp);
  return res;
}